

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::BreakpointEvent>::construct
          (BasicTypeInfo<dap::BreakpointEvent> *this,void *ptr)

{
  memset(ptr,0,0x210);
  Breakpoint::Breakpoint((Breakpoint *)ptr);
  *(long *)((long)ptr + 0x1f0) = (long)ptr + 0x200;
  *(undefined8 *)((long)ptr + 0x1f8) = 0;
  *(undefined1 *)((long)ptr + 0x200) = 0;
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }